

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::doProcess(QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
                  function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,
                  bool used_for_input,bool main_input)

{
  element_type *peVar1;
  pointer ppcVar2;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  pointer pbVar3;
  char *password_local;
  uint local_12c;
  vector<const_char_*,_std::allocator<const_char_*>_> passwords;
  pointer local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passwords_str;
  string ptemp;
  string local_90;
  function<void_(QPDF_*,_const_char_*)> local_70;
  function<void_(QPDF_*,_const_char_*)> local_50;
  
  ptemp._M_dataplus._M_p = (pointer)&ptemp.field_2;
  ptemp._M_string_length = 0;
  ptemp.field_2._M_local_buf[0] = '\0';
  password_local = password;
  if (password != (char *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->password_is_hex_key == false) && (peVar1->password_mode == pm_hex_bytes)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&passwords,password,(allocator<char> *)&local_100);
      QUtil::hex_decode((string *)&passwords_str,(string *)&passwords);
      std::__cxx11::string::operator=((string *)&ptemp,(string *)&passwords_str);
      std::__cxx11::string::~string((string *)&passwords_str);
      std::__cxx11::string::~string((string *)&passwords);
      password_local = ptemp._M_dataplus._M_p;
    }
    if (((password_local != (char *)0x0 && !empty) &&
        (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar1->password_is_hex_key == false)) && (peVar1->suppress_password_recovery != true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,password_local,(allocator<char> *)&passwords);
      QUtil::possible_repaired_encodings(&passwords_str,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (pbVar3 = passwords_str.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 != passwords_str.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
        local_100 = (pbVar3->_M_dataplus)._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&passwords,&local_100);
      }
      if (8 < (ulong)((long)passwords.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (&passwords,&password_local);
      }
      ppcVar2 = passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_12c = (uint)main_input;
      if (passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"do_process returned");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::function<void_(QPDF_*,_const_char_*)>::function(&local_50,fn);
      doProcessOnce(this,pdf,&local_50,*ppcVar2,false,used_for_input,SUB41(local_12c,0));
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&passwords_str);
      goto LAB_00169dad;
    }
  }
  std::function<void_(QPDF_*,_const_char_*)>::function(&local_70,fn);
  doProcessOnce(this,pdf,&local_70,password_local,empty,used_for_input,main_input);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
LAB_00169dad:
  std::__cxx11::string::~string((string *)&ptemp);
  return;
}

Assistant:

void
QPDFJob::doProcess(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    // If a password has been specified but doesn't work, try other passwords that are equivalent in
    // different character encodings. This makes it possible to open PDF files that were encrypted
    // using incorrect string encodings. For example, if someone used a password encoded in PDF Doc
    // encoding or Windows code page 1252 for an AES-encrypted file or a UTF-8-encoded password on
    // an RC4-encrypted file, or if the password was properly encoded but the password given here
    // was incorrectly encoded, there's a good chance we'd succeed here.

    std::string ptemp;
    if (password && (!m->password_is_hex_key)) {
        if (m->password_mode == QPDFJob::pm_hex_bytes) {
            // Special case: handle --password-mode=hex-bytes for input password as well as output
            // password
            QTC::TC("qpdf", "QPDFJob input password hex-bytes");
            ptemp = QUtil::hex_decode(password);
            password = ptemp.c_str();
        }
    }
    if ((password == nullptr) || empty || m->password_is_hex_key || m->suppress_password_recovery) {
        // There is no password, or we're not doing recovery, so just do the normal processing with
        // the supplied password.
        doProcessOnce(pdf, fn, password, empty, used_for_input, main_input);
        return;
    }

    // Get a list of otherwise encoded strings. Keep in scope for this method.
    std::vector<std::string> passwords_str = QUtil::possible_repaired_encodings(password);
    // Represent to char const*, as required by the QPDF class.
    std::vector<char const*> passwords;
    for (auto const& iter: passwords_str) {
        passwords.push_back(iter.c_str());
    }
    // We always try the supplied password first because it is the first string returned by
    // possible_repaired_encodings. If there is more than one option, go ahead and put the supplied
    // password at the end so that it's that decoding attempt whose exception is thrown.
    if (passwords.size() > 1) {
        passwords.push_back(password);
    }

    // Try each password. If one works, return the resulting object. If they all fail, throw the
    // exception thrown by the final attempt, which, like the first attempt, will be with the
    // supplied password.
    bool warned = false;
    for (auto iter = passwords.begin(); iter != passwords.end(); ++iter) {
        try {
            doProcessOnce(pdf, fn, *iter, empty, used_for_input, main_input);
            return;
        } catch (QPDFExc&) {
            auto next = iter;
            ++next;
            if (next == passwords.end()) {
                throw;
            }
        }
        if (!warned) {
            warned = true;
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix
                  << ": supplied password didn't work; trying other passwords based on "
                     "interpreting password with different string encodings\n";
            });
        }
    }
    // Should not be reachable
    throw std::logic_error("do_process returned");
}